

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

ssize_t __thiscall
kj::anon_unknown_30::DatagramPortImpl::send
          (DatagramPortImpl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  int osErrorNumber;
  NetworkAddressImpl *this_00;
  void *pvVar1;
  undefined4 in_register_00000034;
  undefined4 in_register_00000084;
  undefined8 local_b8;
  void *local_b0;
  size_t local_a8;
  NetworkAddress *local_a0;
  undefined1 local_98 [40];
  Fault f;
  SyscallResult local_44;
  undefined1 auStack_40 [4];
  SyscallResult _kjSyscallResult;
  ssize_t n;
  SocketAddress *addr;
  NetworkAddress *destination_local;
  size_t size_local;
  void *buffer_local;
  DatagramPortImpl *this_local;
  
  this_00 = downcast<kj::(anonymous_namespace)::NetworkAddressImpl,kj::NetworkAddress>
                      ((NetworkAddress *)CONCAT44(in_register_00000084,__flags));
  NetworkAddressImpl::chooseOneAddress(this_00);
  f.exception = (Exception *)auStack_40;
  local_44 = kj::_::Debug::
             syscall<kj::(anonymous_namespace)::DatagramPortImpl::send(void_const*,unsigned_long,kj::NetworkAddress&)::__0>
                       ((anon_class_40_5_4c428232 *)&f,true);
  pvVar1 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_44);
  if (pvVar1 != (void *)0x0) {
    if ((long)_auStack_40 < 0) {
      UnixEventPort::FdObserver::whenBecomesWritable((FdObserver *)local_98);
      local_b8 = CONCAT44(in_register_00000034,__fd);
      local_b0 = __buf;
      local_a8 = __n;
      local_a0 = (NetworkAddress *)CONCAT44(in_register_00000084,__flags);
      Promise<void>::
      then<kj::(anonymous_namespace)::DatagramPortImpl::send(void_const*,unsigned_long,kj::NetworkAddress&)::__1,kj::_::PropagateException>
                ((Promise<void> *)this,(Type *)local_98,(PropagateException *)&local_b8);
      Promise<void>::~Promise((Promise<void> *)local_98);
    }
    else {
      Promise<unsigned_long>::Promise
                ((Promise<unsigned_long> *)this,(FixVoid<unsigned_long>)_auStack_40);
    }
    return (ssize_t)this;
  }
  osErrorNumber = kj::_::Debug::SyscallResult::getErrorNumber(&local_44);
  kj::_::Debug::Fault::Fault
            ((Fault *)(local_98 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
             ,0x521,osErrorNumber,
             "n = sendto(fd, buffer, size, 0, addr.getRaw(), addr.getRawSize())","");
  kj::_::Debug::Fault::fatal((Fault *)(local_98 + 0x20));
}

Assistant:

Promise<size_t> DatagramPortImpl::send(
    const void* buffer, size_t size, NetworkAddress& destination) {
  auto& addr = downcast<NetworkAddressImpl>(destination).chooseOneAddress();

  ssize_t n;
  KJ_NONBLOCKING_SYSCALL(n = sendto(fd, buffer, size, 0, addr.getRaw(), addr.getRawSize()));
  if (n < 0) {
    // Write buffer full.
    return observer.whenBecomesWritable().then([this, buffer, size, &destination]() {
      return send(buffer, size, destination);
    });
  } else {
    // If less than the whole message was sent, then it got truncated, and there's nothing we can
    // do about it.
    return n;
  }
}